

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_DeprecatedEdition_Test::
TestBody(CommandLineInterfaceTest_Plugin_DeprecatedEdition_Test *this)

{
  string_view name;
  string_view expected_substring;
  string_view contents;
  allocator<char> local_31;
  string local_30;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "\n    edition = \"2023\";\n    message Foo {\n      int32 i = 1;\n    }\n  ";
  contents._M_len = 0x44;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  setenv("TEST_CASE","high_minimum",1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "protocol_compiler --proto_path=$tmpdir foo.proto --plug_out=$tmpdir",&local_31);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  expected_substring._M_str =
       "foo.proto: is a file using edition 2023, which isn\'t supported by code generator prefix-gen-plug.  Please upgrade your file to at least edition 99997_TEST_ONLY."
  ;
  expected_substring._M_len = 0xa0;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_DeprecatedEdition) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("high_minimum");
  Run("protocol_compiler "
      "--proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring(
      "foo.proto: is a file using edition 2023, which isn't supported by code "
      "generator prefix-gen-plug.  Please upgrade your file to at least "
      "edition 99997_TEST_ONLY.");
}